

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-opt.h
# Opt level: O0

void __thiscall
mp::SolverOptionManager::
ConcreteOption<mp::BasicSolver,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::GetValue(ConcreteOption<mp::BasicSolver,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  long *plVar1;
  string *in_RSI;
  long in_RDI;
  code *local_50;
  string local_30 [32];
  string *local_10;
  
  local_50 = *(code **)(in_RDI + 0xd8);
  plVar1 = (long *)(*(long *)(in_RDI + 0xd0) + *(long *)(in_RDI + 0xe0));
  if (((ulong)local_50 & 1) != 0) {
    local_50 = *(code **)(local_50 + *plVar1 + -1);
  }
  local_10 = in_RSI;
  (*local_50)(local_30,plVar1,in_RDI);
  std::__cxx11::string::operator=(local_10,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void GetValue(T &value) const { value = (handler_.*get_)(*this); }